

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O3

size_t populate(uint16_t *buffer,size_t maxsize)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = splitmix64_x + 0x9e3779b97f4a7c15;
  uVar1 = (uVar4 >> 0x1e ^ uVar4) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = (uVar1 >> 0x1f ^ uVar1) % maxsize;
  if (uVar1 != 0) {
    uVar5 = splitmix64_x + 0x3c6ef372fe94f82a;
    uVar2 = 0;
    do {
      uVar4 = uVar4 + 0x9e3779b97f4a7c15;
      uVar3 = (uVar5 >> 0x1e ^ uVar5) * -0x40a7b892e31b1a47;
      uVar3 = (uVar3 >> 0x1b ^ uVar3) * -0x6b2fb644ecceee15;
      buffer[uVar2] = (ushort)(uVar3 >> 0x1f) ^ (ushort)uVar3;
      uVar2 = uVar2 + 1;
      uVar5 = uVar5 + 0x9e3779b97f4a7c15;
    } while (uVar2 < uVar1);
  }
  splitmix64_x = uVar4;
  return uVar1;
}

Assistant:

size_t populate(uint16_t* buffer, size_t maxsize) {
    size_t length = splitmix64() % maxsize;
    for (size_t i = 0; i < length; i++) {
        buffer[i] = (uint16_t)splitmix64();
    }
    return length;
}